

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssxmlExporter.cpp
# Opt level: O2

void Assimp::AssxmlExport::ConvertName(aiString *out,aiString *in)

{
  char cVar1;
  uint uVar2;
  char *app;
  uint i;
  ulong uVar3;
  
  out->length = 0;
  uVar3 = 0;
  do {
    if (in->length <= uVar3) {
      out->data[out->length] = '\0';
      return;
    }
    cVar1 = in->data[uVar3];
    if (cVar1 == '\"') {
      app = "&quot;";
LAB_0032800c:
      aiString::Append(out,app);
    }
    else {
      if (cVar1 == '&') {
        app = "&amp;";
        goto LAB_0032800c;
      }
      if (cVar1 == '\'') {
        app = "&apos;";
        goto LAB_0032800c;
      }
      if (cVar1 == '>') {
        app = "&gt;";
        goto LAB_0032800c;
      }
      if (cVar1 == '<') {
        app = "&lt;";
        goto LAB_0032800c;
      }
      uVar2 = out->length;
      out->length = uVar2 + 1;
      out->data[uVar2] = cVar1;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

static void ConvertName(aiString& out, const aiString& in) {
    out.length = 0;
    for (unsigned int i = 0; i < in.length; ++i)  {
        switch (in.data[i]) {
            case '<':
                out.Append("&lt;");break;
            case '>':
                out.Append("&gt;");break;
            case '&':
                out.Append("&amp;");break;
            case '\"':
                out.Append("&quot;");break;
            case '\'':
                out.Append("&apos;");break;
            default:
                out.data[out.length++] = in.data[i];
        }
    }
    out.data[out.length] = 0;
}